

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O2

void pg::freeze_thaw_reset_rec_SYNC(WorkerP *w,Task *__dq_head)

{
  atomic<unsigned_int> *paVar1;
  Worker *pWVar2;
  int iVar3;
  ulong uVar4;
  
  if ((w->_public->movesplit == '\0') && (w->split <= __dq_head)) {
    (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
    freeze_thaw_reset_rec_CALL
              (w,__dq_head,*(FPISolver **)__dq_head->d,*(int *)(__dq_head->d + 8),
               *(int *)(__dq_head->d + 0xc),*(int *)(__dq_head->d + 0x10));
    return;
  }
  if (w->allstolen != '\0') {
LAB_0014f038:
    lace_leapfrog(w,__dq_head);
    return;
  }
  if (__dq_head < w->split) {
    iVar3 = lace_shrink_shared(w);
    if (iVar3 != 0) goto LAB_0014f038;
  }
  pWVar2 = w->_public;
  if (pWVar2->movesplit != '\0') {
    uVar4 = ((long)__dq_head - (long)w->split >> 6) + 1U >> 1;
    w->split = w->split + uVar4;
    LOCK();
    paVar1 = &(pWVar2->ts).ts.split;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + (int)uVar4;
    UNLOCK();
    pWVar2->movesplit = '\0';
  }
  (__dq_head->thief)._M_b._M_p = (__pointer_type)0x0;
  freeze_thaw_reset_rec_CALL
            (w,__dq_head,*(FPISolver **)__dq_head->d,*(int *)(__dq_head->d + 8),
             *(int *)(__dq_head->d + 0xc),*(int *)(__dq_head->d + 0x10));
  return;
}

Assistant:

VOID_TASK_4(freeze_thaw_reset_rec, FPISolver*, solver, int, i, int, n, int, p)
{
    if (n>128) {
        // because dynamic bitset is not thread safe, work in blocks of 64...
        if (i&127) {
            // start not yet aligned
            int N = 128 - (i&127);
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            solver->freezeThawReset(i, N, p);
            SYNC(freeze_thaw_reset_rec);
        } else {
            int N = (n/128)*64;
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            CALL(freeze_thaw_reset_rec, solver, i, N, p);
            SYNC(freeze_thaw_reset_rec);
        }
    } else {
        solver->freezeThawReset(i, n, p);
    }
}